

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pNext;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar2 = Gia_ObjIsAnd(pObj);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x199,
                    "void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = Gia_ObjId(p,pObj);
    pObj_00 = Gia_ObjNextObj(p,iVar2);
    if (pObj_00 != (Gia_Obj_t *)0x0) {
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj_00);
    }
    pGVar5 = Gia_ObjFanin0(pObj);
    Gia_ManDupOrderDfsChoices_rec(pNew,p,pGVar5);
    pGVar5 = Gia_ObjFanin1(pObj);
    Gia_ManDupOrderDfsChoices_rec(pNew,p,pGVar5);
    iVar2 = Gia_ObjFanin0Copy(pObj);
    iVar3 = Gia_ObjFanin1Copy(pObj);
    uVar4 = Gia_ManAppendAnd(pNew,iVar2,iVar3);
    pObj->Value = uVar4;
    if (pObj_00 != (Gia_Obj_t *)0x0) {
      iVar2 = Abc_Lit2Var(pObj_00->Value);
      iVar2 = Abc_Lit2Var(iVar2);
      piVar1 = pNew->pNexts;
      iVar3 = Abc_Lit2Var(pObj->Value);
      piVar1[iVar3] = iVar2;
      iVar2 = Abc_Lit2Var(pObj->Value);
      iVar3 = Abc_Lit2Var(pObj_00->Value);
      if (iVar2 <= iVar3) {
        __assert_fail("Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pNext->Value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0x1a3,
                      "void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
    }
  }
  return;
}

Assistant:

void Gia_ManDupOrderDfsChoices_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pNext;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pNext = Gia_ObjNextObj( p, Gia_ObjId(p, pObj) );
    if ( pNext )
        Gia_ManDupOrderDfsChoices_rec( pNew, p, pNext );
    Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( pNext )
    {
        pNew->pNexts[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var( Abc_Lit2Var(pNext->Value) );
        assert( Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pNext->Value) );
    }
}